

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test8::initIteration(GPUShaderFP64Test8 *this,_test_case *test_case)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GPUShaderFP64Test8 *pGVar3;
  char *vs_body_raw_ptr;
  char *te_body_raw_ptr;
  char *tc_body_raw_ptr;
  char *gs_body_raw_ptr;
  char *fs_body_raw_ptr;
  char *cs_body_raw_ptr;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  getComputeShaderBody_abi_cxx11_((string *)&cs_body_raw_ptr,this,test_case);
  pGVar3 = (GPUShaderFP64Test8 *)&cs_body_raw_ptr;
  std::__cxx11::string::operator=((string *)&test_case->cs_shader_body,(string *)&cs_body_raw_ptr);
  std::__cxx11::string::~string((string *)&cs_body_raw_ptr);
  getFragmentShaderBody_abi_cxx11_((string *)&cs_body_raw_ptr,pGVar3,test_case);
  pGVar3 = (GPUShaderFP64Test8 *)&cs_body_raw_ptr;
  std::__cxx11::string::operator=((string *)&test_case->fs_shader_body,(string *)&cs_body_raw_ptr);
  std::__cxx11::string::~string((string *)&cs_body_raw_ptr);
  getGeometryShaderBody_abi_cxx11_((string *)&cs_body_raw_ptr,pGVar3,test_case);
  pGVar3 = (GPUShaderFP64Test8 *)&cs_body_raw_ptr;
  std::__cxx11::string::operator=((string *)&test_case->gs_shader_body,(string *)&cs_body_raw_ptr);
  std::__cxx11::string::~string((string *)&cs_body_raw_ptr);
  getTessellationControlShaderBody_abi_cxx11_((string *)&cs_body_raw_ptr,pGVar3,test_case);
  pGVar3 = (GPUShaderFP64Test8 *)&cs_body_raw_ptr;
  std::__cxx11::string::operator=((string *)&test_case->tc_shader_body,(string *)&cs_body_raw_ptr);
  std::__cxx11::string::~string((string *)&cs_body_raw_ptr);
  getTessellationEvaluationShaderBody_abi_cxx11_((string *)&cs_body_raw_ptr,pGVar3,test_case);
  pGVar3 = (GPUShaderFP64Test8 *)&cs_body_raw_ptr;
  std::__cxx11::string::operator=((string *)&test_case->te_shader_body,(string *)&cs_body_raw_ptr);
  std::__cxx11::string::~string((string *)&cs_body_raw_ptr);
  getVertexShaderBody_abi_cxx11_((string *)&cs_body_raw_ptr,pGVar3,test_case);
  std::__cxx11::string::operator=((string *)&test_case->vs_shader_body,(string *)&cs_body_raw_ptr);
  std::__cxx11::string::~string((string *)&cs_body_raw_ptr);
  cs_body_raw_ptr = (test_case->cs_shader_body)._M_dataplus._M_p;
  fs_body_raw_ptr = (test_case->fs_shader_body)._M_dataplus._M_p;
  gs_body_raw_ptr = (test_case->gs_shader_body)._M_dataplus._M_p;
  tc_body_raw_ptr = (test_case->tc_shader_body)._M_dataplus._M_p;
  te_body_raw_ptr = (test_case->te_shader_body)._M_dataplus._M_p;
  vs_body_raw_ptr = (test_case->vs_shader_body)._M_dataplus._M_p;
  if (this->m_cs_id != 0) {
    (**(code **)(lVar2 + 0x12b8))(this->m_cs_id,1,&cs_body_raw_ptr,0);
  }
  (**(code **)(lVar2 + 0x12b8))(this->m_fs_id,1,&fs_body_raw_ptr,0);
  (**(code **)(lVar2 + 0x12b8))(this->m_gs_id,1,&gs_body_raw_ptr,0);
  (**(code **)(lVar2 + 0x12b8))(this->m_tc_id,1,&tc_body_raw_ptr,0);
  (**(code **)(lVar2 + 0x12b8))(this->m_te_id,1,&te_body_raw_ptr,0);
  (**(code **)(lVar2 + 0x12b8))(this->m_vs_id,1,&vs_body_raw_ptr,0);
  err = (**(code **)(lVar2 + 0x800))();
  glu::checkError(err,"glShaderSource() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x2adf);
  return;
}

Assistant:

void GPUShaderFP64Test8::initIteration(_test_case& test_case)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	test_case.cs_shader_body = getComputeShaderBody(test_case);
	test_case.fs_shader_body = getFragmentShaderBody(test_case);
	test_case.gs_shader_body = getGeometryShaderBody(test_case);
	test_case.tc_shader_body = getTessellationControlShaderBody(test_case);
	test_case.te_shader_body = getTessellationEvaluationShaderBody(test_case);
	test_case.vs_shader_body = getVertexShaderBody(test_case);

	/* Assign the bodies to relevant shaders */
	const char* cs_body_raw_ptr = test_case.cs_shader_body.c_str();
	const char* fs_body_raw_ptr = test_case.fs_shader_body.c_str();
	const char* gs_body_raw_ptr = test_case.gs_shader_body.c_str();
	const char* tc_body_raw_ptr = test_case.tc_shader_body.c_str();
	const char* te_body_raw_ptr = test_case.te_shader_body.c_str();
	const char* vs_body_raw_ptr = test_case.vs_shader_body.c_str();

	/* m_cs_id is initialized only if compute_shader is supported */
	if (0 != m_cs_id)
	{
		gl.shaderSource(m_cs_id, 1 /* count */, &cs_body_raw_ptr, DE_NULL /* length */);
	}

	gl.shaderSource(m_fs_id, 1 /* count */, &fs_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_gs_id, 1 /* count */, &gs_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_tc_id, 1 /* count */, &tc_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_te_id, 1 /* count */, &te_body_raw_ptr, DE_NULL /* length */);
	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call(s) failed.");
}